

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localintermediate.h
# Opt level: O0

void __thiscall glslang::TIntermediate::addRequestedExtension(TIntermediate *this,char *extension)

{
  value_type *__x;
  allocator<char> local_39;
  _Base_ptr local_18;
  char *extension_local;
  TIntermediate *this_local;
  
  local_18 = (_Base_ptr)extension;
  extension_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffffc8,extension,&local_39);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert((pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
            *)&this->requestedExtensions,
           (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&stack0xffffffffffffffc8,__x);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void addRequestedExtension(const char* extension) { requestedExtensions.insert(extension); }